

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O1

void AddTriangles(Level *Lvl)

{
  uint uVar1;
  Triangle *NewTri;
  Vertex *pVVar2;
  double *pdVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  for (NewTri = Lvl->AllTris; NewTri != (Triangle *)0x0; NewTri = NewTri->Next) {
    pVVar2 = NewTri->Edges[0];
    dVar6 = pVVar2->Pos[0];
    (NewTri->Bounder).BR.Pos[0] = dVar6;
    (NewTri->Bounder).TL.Pos[0] = dVar6;
    dVar7 = pVVar2->Pos[1];
    (NewTri->Bounder).BR.Pos[1] = dVar7;
    (NewTri->Bounder).TL.Pos[1] = dVar7;
    lVar4 = 0x14;
    dVar7 = dVar6;
    do {
      iVar5 = (int)lVar4 + -0x13;
      if ((int)lVar4 - 0x11U < 2) {
        iVar5 = 2;
      }
      pdVar3 = *(double **)((long)(&NewTri->Bounder + -3) + lVar4 * 8);
      dVar8 = *pdVar3;
      if (dVar8 < dVar6) {
        (NewTri->Bounder).TL.Pos[0] = dVar8;
        dVar6 = dVar8;
      }
      dVar8 = *pdVar3;
      if (dVar7 < dVar8) {
        (NewTri->Bounder).BR.Pos[0] = dVar8;
        dVar7 = dVar8;
      }
      uVar1 = *(uint *)((long)(NewTri->Bounder).TL.Pos + lVar4 * 4);
      if (((char)uVar1 < '\0') || ((NewTri->EdgeFlags[iVar5] & 0x80) != 0)) {
        dVar8 = (double)(uVar1 & 0x7f);
        dVar9 = pdVar3[1] - dVar8;
        if (dVar9 < (NewTri->Bounder).TL.Pos[1]) {
          (NewTri->Bounder).TL.Pos[1] = dVar9;
        }
        dVar8 = dVar8 + pdVar3[1];
      }
      else {
        if (pdVar3[1] < (NewTri->Bounder).TL.Pos[1]) {
          (NewTri->Bounder).TL.Pos[1] = pdVar3[1];
        }
        dVar8 = pdVar3[1];
      }
      pdVar3 = (NewTri->Bounder).BR.Pos + 1;
      if (*pdVar3 <= dVar8 && dVar8 != *pdVar3) {
        (NewTri->Bounder).BR.Pos[1] = dVar8;
      }
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0x11);
    AddTriangle(Lvl,NewTri);
  }
  return;
}

Assistant:

static void AddTriangles(struct Level *Lvl)
{
   struct Triangle *Tri = Lvl->AllTris;

   while (Tri) {
      int c = 3;

      /* determine axis aligned bounding box */
      Tri->Bounder.TL.Pos[0] = Tri->Bounder.BR.Pos[0] = Tri->Edges[0]->Pos[0];
      Tri->Bounder.TL.Pos[1] = Tri->Bounder.BR.Pos[1] = Tri->Edges[0]->Pos[1];

      while (c--) {
         int lc = c - 1;

         if (lc < 0)
            lc = 2;

         /* check if this x expands the bounding box either leftward or rightward */
         if (Tri->Edges[c]->Pos[0] < Tri->Bounder.TL.Pos[0])
            Tri->Bounder.TL.Pos[0] = Tri->Edges[c]->Pos[0];
         if (Tri->Edges[c]->Pos[0] > Tri->Bounder.BR.Pos[0])
            Tri->Bounder.BR.Pos[0] = Tri->Edges[c]->Pos[0];

         /* check y */
         if ((Tri->EdgeFlags[c] & TRIFLAGS_EDGE)
             || (Tri->EdgeFlags[lc] & TRIFLAGS_EDGE)) {
            if (Tri->Edges[c]->Pos[1] -
                (Tri->EdgeFlags[c] & TRIFLAGS_WIDTH) < Tri->Bounder.TL.Pos[1])
               Tri->Bounder.TL.Pos[1] =
                  Tri->Edges[c]->Pos[1] -
                  (Tri->EdgeFlags[c] & TRIFLAGS_WIDTH);
            if (Tri->Edges[c]->Pos[1] + (Tri->EdgeFlags[c] & TRIFLAGS_WIDTH) >
                Tri->Bounder.BR.Pos[1])
               Tri->Bounder.BR.Pos[1] =
                  Tri->Edges[c]->Pos[1] +
                  (Tri->EdgeFlags[c] & TRIFLAGS_WIDTH);
         } else {
            if (Tri->Edges[c]->Pos[1] < Tri->Bounder.TL.Pos[1])
               Tri->Bounder.TL.Pos[1] = Tri->Edges[c]->Pos[1];
            if (Tri->Edges[c]->Pos[1] > Tri->Bounder.BR.Pos[1])
               Tri->Bounder.BR.Pos[1] = Tri->Edges[c]->Pos[1];
         }
      }

      /* insert into tree */
      AddTriangle(Lvl, Tri);

      /* move along linked list */
      Tri = Tri->Next;
   }
}